

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O1

void __thiscall
QGraphicsProxyWidget::hoverMoveEvent(QGraphicsProxyWidget *this,QGraphicsSceneHoverEvent *event)

{
  QGraphicsProxyWidgetPrivate *this_00;
  Data *pDVar1;
  char cVar2;
  QPoint QVar3;
  QWidget *leave;
  long in_FS_OFFSET;
  QSizeF QVar4;
  QPointF local_48;
  qreal local_38;
  qreal local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsProxyWidgetPrivate **)(this + 0x18);
  pDVar1 = (this_00->widget).wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     ((this_00->widget).wp.value != (QObject *)0x0)) {
    QVar4 = QGraphicsWidget::size((QGraphicsWidget *)this);
    local_30 = QVar4.ht;
    local_48.xp = 0.0;
    local_48.yp = 0.0;
    local_38 = QVar4.wd;
    QGraphicsSceneHoverEvent::pos(event);
    cVar2 = QRectF::contains(&local_48);
    if (cVar2 != '\0') {
      pDVar1 = (this_00->embeddedMouseGrabber).wp.d;
      (this_00->embeddedMouseGrabber).wp.d = (Data *)0x0;
      (this_00->embeddedMouseGrabber).wp.value = (QObject *)0x0;
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        *(int *)pDVar1 = *(int *)pDVar1 + -1;
        UNLOCK();
        if (*(int *)pDVar1 == 0) {
          operator_delete(pDVar1);
        }
      }
      QGraphicsProxyWidgetPrivate::sendWidgetMouseEvent(this_00,event);
      goto LAB_00609478;
    }
  }
  pDVar1 = (this_00->lastWidgetUnderMouse).wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     ((this_00->lastWidgetUnderMouse).wp.value != (QObject *)0x0)) {
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      leave = (QWidget *)0x0;
    }
    else {
      leave = (QWidget *)(this_00->lastWidgetUnderMouse).wp.value;
    }
    QVar3 = QGraphicsSceneHoverEvent::screenPos(event);
    local_48.xp = (qreal)QVar3.xp.m_i.m_i;
    local_48.yp = (qreal)QVar3.yp.m_i.m_i;
    QApplicationPrivate::dispatchEnterLeave((QWidget *)0x0,leave,&local_48);
    pDVar1 = (this_00->lastWidgetUnderMouse).wp.d;
    (this_00->lastWidgetUnderMouse).wp.d = (Data *)0x0;
    (this_00->lastWidgetUnderMouse).wp.value = (QObject *)0x0;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar1 = *(int *)pDVar1 + -1;
      UNLOCK();
      if (*(int *)pDVar1 == 0) {
        operator_delete(pDVar1);
      }
    }
  }
LAB_00609478:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsProxyWidget::hoverMoveEvent(QGraphicsSceneHoverEvent *event)
{
    Q_D(QGraphicsProxyWidget);
#ifdef GRAPHICSPROXYWIDGET_DEBUG
    qDebug("QGraphicsProxyWidget::hoverMoveEvent");
#endif
    // Ignore events on the window frame.
    if (!d->widget || !rect().contains(event->pos())) {
        if (d->lastWidgetUnderMouse) {
            QApplicationPrivate::dispatchEnterLeave(nullptr, d->lastWidgetUnderMouse, event->screenPos());
            d->lastWidgetUnderMouse = nullptr;
        }
        return;
    }

    d->embeddedMouseGrabber = nullptr;
    d->sendWidgetMouseEvent(event);
}